

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O2

void duckdb_destroy_vector(duckdb_vector *vector)

{
  Vector *this;
  Vector *dvector;
  
  if ((vector != (duckdb_vector *)0x0) && (this = (Vector *)*vector, this != (Vector *)0x0)) {
    duckdb::Vector::~Vector(this);
    operator_delete(this);
    *vector = (duckdb_vector)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_vector(duckdb_vector *vector) {
	if (vector && *vector) {
		auto dvector = reinterpret_cast<duckdb::Vector *>(*vector);
		delete dvector;
		*vector = nullptr;
	}
}